

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O2

ssize_t __thiscall Pl_Flate::write(Pl_Flate *this,int __fd,void *__buf,size_t __n)

{
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tVar1;
  ssize_t sVar2;
  Members *pMVar3;
  Members *extraout_RAX;
  logic_error *this_00;
  undefined4 in_register_00000034;
  void *len;
  uchar *data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  data = (uchar *)CONCAT44(in_register_00000034,__fd);
  pMVar3 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>._M_t.
           super__Tuple_impl<0UL,_Pl_Flate::Members_*,_std::default_delete<Pl_Flate::Members>_>.
           super__Head_base<0UL,_Pl_Flate::Members_*,_false>._M_head_impl;
  if (*(long *)&(pMVar3->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> == 0)
  {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,&(this->super_Pipeline).identifier,
                   ": Pl_Flate: write() called after finish() called");
    std::logic_error::logic_error(this_00,(string *)&local_50);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  tVar1.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       *(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&(pMVar3->zopfli_buf)._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  if (tVar1.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl ==
      (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    for (; __buf != (void *)0x0; __buf = (void *)((long)__buf - (long)len)) {
      len = (void *)0x40000000;
      if (__buf < (void *)0x40000000) {
        len = __buf;
      }
      handleData(this,data,(size_t)len,
                 (uint)(((this->m)._M_t.
                         super___uniq_ptr_impl<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Pl_Flate::Members_*,_std::default_delete<Pl_Flate::Members>_>
                         .super__Head_base<0UL,_Pl_Flate::Members_*,_false>._M_head_impl)->action ==
                       a_inflate) * 2);
      data = data + (long)len;
      pMVar3 = extraout_RAX;
    }
    return (ssize_t)pMVar3;
  }
  sVar2 = std::__cxx11::string::append
                    ((char *)tVar1.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,(ulong)data);
  return sVar2;
}

Assistant:

void
Pl_Flate::write(unsigned char const* data, size_t len)
{
    if (m->outbuf == nullptr) {
        throw std::logic_error(
            this->identifier + ": Pl_Flate: write() called after finish() called");
    }
    if (m->zopfli_buf) {
        m->zopfli_buf->append(reinterpret_cast<char const*>(data), len);
        return;
    }

    // Write in chunks in case len is too big to fit in an int. Assume int is at least 32 bits.
    static size_t const max_bytes = 1 << 30;
    size_t bytes_left = len;
    unsigned char const* buf = data;
    while (bytes_left > 0) {
        size_t bytes = (bytes_left >= max_bytes ? max_bytes : bytes_left);
        handleData(buf, bytes, (m->action == a_inflate ? Z_SYNC_FLUSH : Z_NO_FLUSH));
        bytes_left -= bytes;
        buf += bytes;
    }
}